

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

float __thiscall Quat4f::absSquared(Quat4f *this)

{
  undefined1 auVar1 [16];
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(this->m_elements[1] * this->m_elements[1])),
                           ZEXT416((uint)this->m_elements[0]),ZEXT416((uint)this->m_elements[0]));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)this->m_elements[2]),ZEXT416((uint)this->m_elements[2]),
                           auVar1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)this->m_elements[3]),ZEXT416((uint)this->m_elements[3]),
                           auVar1);
  return auVar1._0_4_;
}

Assistant:

float Quat4f::absSquared() const
{
	return
	(
		m_elements[ 0 ] * m_elements[ 0 ] +
		m_elements[ 1 ] * m_elements[ 1 ] +
		m_elements[ 2 ] * m_elements[ 2 ] +
		m_elements[ 3 ] * m_elements[ 3 ]
	);
}